

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O3

void __thiscall TasGrid::GridGlobal::loadGpuNodes<double>(GridGlobal *this)

{
  AccelerationContext *pAVar1;
  pointer piVar2;
  int *piVar3;
  void *pvVar4;
  double *pdVar5;
  bool bVar6;
  int iVar7;
  pointer __p_00;
  long lVar8;
  int *piVar9;
  int iVar10;
  int *piVar11;
  double *pdVar12;
  int *piVar13;
  CudaGlobalData<double> *pCVar14;
  int iVar15;
  pointer __p;
  vector<int,_std::allocator<int>_> map_dims;
  int num_basis;
  vector<int,_std::allocator<int>_> active_num_points;
  vector<int,_std::allocator<int>_> map_tensor;
  vector<int,_std::allocator<int>_> map_reference;
  vector<int,_std::allocator<int>_> map_index;
  vector<int,_std::allocator<int>_> dim_offsets;
  vector<int,_std::allocator<int>_> map_level;
  vector<double,_std::allocator<double>_> tweights;
  int local_130;
  int local_12c;
  vector<double,_std::allocator<double>_> local_128;
  int local_104;
  vector<int,_std::allocator<int>_> local_100;
  int *local_e8;
  iterator iStack_e0;
  int *local_d8;
  int *local_c8;
  iterator iStack_c0;
  int *local_b8;
  int *local_a8;
  iterator iStack_a0;
  int *local_98;
  int *local_88;
  iterator iStack_80;
  int *local_78;
  int *local_68;
  iterator iStack_60;
  int *local_58;
  vector<double,_std::allocator<double>_> local_48;
  
  pCVar14 = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
  if (pCVar14 == (CudaGlobalData<double> *)0x0) {
    __p_00 = (pointer)operator_new(0xe8);
    memset(__p_00,0,0xe8);
    local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    ::std::
    __uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             *)&this->gpu_cache,__p_00);
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                   *)&local_128);
    pCVar14 = (this->gpu_cache)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
  }
  if ((pCVar14->nodes).num_entries == 0) {
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    bVar6 = OneDimensionalMeta::isNonNested(this->rule);
    if (bVar6) {
      Utils::mergeVectors<double>(&local_128,&(this->wrapper).nodes);
    }
    else {
      ::std::vector<double,_std::allocator<double>_>::vector(&local_128,&(this->wrapper).unique);
    }
    GpuVector<double>::load
              (&pCVar14->nodes,pAVar1,
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,
               local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pCVar14 = (this->gpu_cache)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    Utils::mergeVectors<double>(&local_128,&(this->wrapper).coeff);
    GpuVector<double>::load
              (&pCVar14->coeff,pAVar1,
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,
               local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar9 = (this->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                nodes_per_level,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2,piVar9);
    pCVar14 = (this->gpu_cache)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    OneDimensionalWrapper::getOffsetNodesPerLevel
              ((vector<int,_std::allocator<int>_> *)&local_128,&this->wrapper);
    GpuVector<int>::load
              (&pCVar14->offset_per_level,pAVar1,
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               (int *)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58 = (int *)0x0;
    local_68 = (int *)0x0;
    iStack_60._M_current = (int *)0x0;
    local_78 = (int *)0x0;
    local_88 = (int *)0x0;
    iStack_80._M_current = (int *)0x0;
    local_104 = 0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
      do {
        if (iStack_80._M_current == local_78) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_88,iStack_80,&local_104);
        }
        else {
          *iStack_80._M_current = local_104;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        lVar8 = (long)(int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
        if (-1 < (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8]) {
          do {
            if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_128,
                         (iterator)
                         local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_48);
            }
            else {
              *(int *)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish = (int)lVar8;
              local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)local_128.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4);
            }
            if (iStack_60._M_current == local_58) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_68,iStack_60,(int *)&local_100);
            }
            else {
              *iStack_60._M_current =
                   (int)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
            local_104 = local_104 +
                        (this->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [(int)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start];
            iVar7 = (int)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
            lVar8 = (long)(int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
            bVar6 = (int)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start <
                    (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8];
            local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ = iVar7;
          } while (bVar6);
        }
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ =
             (int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
      } while ((int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start <
               (this->super_BaseCanonicalGrid).num_dimensions);
    }
    pCVar14 = (this->gpu_cache)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
    pCVar14->num_basis = local_104;
    GpuVector<int>::load
              (&pCVar14->map_dimension,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               (int *)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_level,(this->super_BaseCanonicalGrid).acceleration,
               (long)iStack_60._M_current - (long)local_68 >> 2,local_68);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_48,
               (long)(this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_100);
    piVar11 = (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pdVar5 = (double *)
             CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      (int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
    pdVar12 = pdVar5;
    for (piVar9 = (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar11; piVar9 = piVar9 + 1) {
      *pdVar12 = (double)*piVar9;
      pdVar12 = pdVar12 + 1;
    }
    GpuVector<double>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                tensor_weights,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar5 >> 3,pdVar5);
    piVar9 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                active_tensors,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2,piVar9);
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_100,
               (long)(this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_e8);
    piVar9 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar11 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar3 = (int *)CONCAT44(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
    if (piVar9 != piVar11) {
      piVar2 = (this->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar13 = piVar3;
      do {
        *piVar13 = piVar2[*piVar9];
        piVar9 = piVar9 + 1;
        piVar13 = piVar13 + 1;
      } while (piVar9 != piVar11);
    }
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                active_num_points,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar3 >> 2,piVar3);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                dim_offsets,(this->super_BaseCanonicalGrid).acceleration,
               (long)iStack_80._M_current - (long)local_88 >> 2,local_88);
    local_e8 = (int *)0x0;
    iStack_e0._M_current = (int *)0x0;
    local_d8 = (int *)0x0;
    local_98 = (int *)0x0;
    local_a8 = (int *)0x0;
    iStack_a0._M_current = (int *)0x0;
    local_b8 = (int *)0x0;
    local_c8 = (int *)0x0;
    iStack_c0._M_current = (int *)0x0;
    piVar9 = (int *)CONCAT44(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
    local_12c = 0;
    iVar7 = (this->active_tensors).cache_num_indexes;
    if (0 < iVar7) {
      do {
        iVar15 = *piVar9;
        iVar10 = (this->super_BaseCanonicalGrid).num_dimensions;
        piVar9 = piVar9 + 1;
        if (1 < iVar10) {
          iVar10 = iVar10 + -1;
          do {
            iVar15 = iVar15 * *piVar9;
            piVar9 = piVar9 + 1;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        local_130 = 0;
        if (0 < iVar15) {
          do {
            if (iStack_e0._M_current == local_d8) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_e8,iStack_e0,&local_12c);
            }
            else {
              *iStack_e0._M_current = local_12c;
              iStack_e0._M_current = iStack_e0._M_current + 1;
            }
            if (iStack_a0._M_current == local_98) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_130);
            }
            else {
              *iStack_a0._M_current = local_130;
              iStack_a0._M_current = iStack_a0._M_current + 1;
            }
            piVar11 = (int *)((long)local_130 * 4 +
                             *(long *)&(this->tensor_refs).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_12c].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data);
            if (iStack_c0._M_current == local_b8) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_c8,iStack_c0,piVar11);
            }
            else {
              *iStack_c0._M_current = *piVar11;
              iStack_c0._M_current = iStack_c0._M_current + 1;
            }
            local_130 = local_130 + 1;
          } while (local_130 < iVar15);
          iVar7 = (this->active_tensors).cache_num_indexes;
        }
        local_12c = local_12c + 1;
      } while (local_12c < iVar7);
    }
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_tensor,(this->super_BaseCanonicalGrid).acceleration,
               (long)iStack_e0._M_current - (long)local_e8 >> 2,local_e8);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_index,(this->super_BaseCanonicalGrid).acceleration,
               (long)iStack_a0._M_current - (long)local_a8 >> 2,local_a8);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_reference,(this->super_BaseCanonicalGrid).acceleration,
               (long)iStack_c0._M_current - (long)local_c8 >> 2,local_c8);
    if (local_c8 != (int *)0x0) {
      operator_delete(local_c8,(long)local_b8 - (long)local_c8);
    }
    if (local_a8 != (int *)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
    if (local_e8 != (int *)0x0) {
      operator_delete(local_e8,(long)local_d8 - (long)local_e8);
    }
    pvVar4 = (void *)CONCAT44(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
    }
    pvVar4 = (void *)CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4)
      ;
    }
    if (local_88 != (int *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
    if (local_68 != (int *)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
    if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void GridGlobal::loadGpuNodes() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaGlobalData<T>>();
    if (!ccache->nodes.empty()) return; // already loaded
    // data for stage 1 (Lagrange caching)
    ccache->nodes.load(acceleration, (OneDimensionalMeta::isNonNested(rule)) ? wrapper.getAllNodes() : wrapper.getUnique());
    ccache->coeff.load(acceleration, wrapper.getAllCoeff());
    ccache->nodes_per_level.load(acceleration, wrapper.getNumNodesPerLevel());
    ccache->offset_per_level.load(acceleration, wrapper.getOffsetNodesPerLevel());

    std::vector<int> map_dims, map_level, dim_offsets;
    int num_basis = 0;
    for(int dim=0; dim<num_dimensions; dim++){
        dim_offsets.push_back(num_basis);
        for(int level=0; level <= max_levels[dim]; level++){
            map_dims.push_back(dim);
            map_level.push_back(level);
            num_basis += wrapper.getNumPoints(level);
        }
    }
    ccache->num_basis = num_basis;
    ccache->map_dimension.load(acceleration, map_dims);
    ccache->map_level.load(acceleration, map_level);

    std::vector<double> tweights(active_w.size());
    std::transform(active_w.begin(), active_w.end(), tweights.begin(), [](int i)->double{ return static_cast<double>(i); });
    ccache->tensor_weights.load(acceleration, tweights);

    ccache->active_tensors.load(acceleration, active_tensors.begin(), active_tensors.end());

    std::vector<int> active_num_points(active_tensors.totalSize());
    std::transform(active_tensors.begin(), active_tensors.end(), active_num_points.begin(), [&](int i)->int{ return wrapper.getNumPoints(i); });
    ccache->active_num_points.load(acceleration, active_num_points);

    ccache->dim_offsets.load(acceleration, dim_offsets);

    std::vector<int> map_tensor, map_index, map_reference;
    auto inump = active_num_points.begin();
    for(int n=0; n<active_tensors.getNumIndexes(); n++){
        int num_tensor_points = *inump++;
        for(int j=1; j<num_dimensions; j++)
            num_tensor_points *= *inump++;

        for(int i=0; i<num_tensor_points; i++){
            map_tensor.push_back(n);
            map_index.push_back(i);
            map_reference.push_back(tensor_refs[n][i]);
        }
    }
    ccache->map_tensor.load(acceleration, map_tensor);
    ccache->map_index.load(acceleration, map_index);
    ccache->map_reference.load(acceleration, map_reference);
}